

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger-inl.h
# Opt level: O2

void __thiscall
spdlog::logger::set_formatter
          (logger *this,unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *f)

{
  pointer psVar1;
  pointer psVar2;
  element_type *peVar3;
  pointer psVar4;
  _Head_base<0UL,_spdlog::formatter_*,_false> local_40;
  long *local_38;
  
  psVar4 = (this->sinks_).
           super__Vector_base<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while (psVar2 = (this->sinks_).
                  super__Vector_base<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish, psVar4 != psVar2) {
    psVar1 = psVar4 + 1;
    peVar3 = (psVar4->super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    psVar4 = psVar1;
    if (psVar1 == psVar2) {
      local_40._M_head_impl =
           (f->_M_t).
           super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
           super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
           super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl;
      (f->_M_t).super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>.
      _M_t.super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
      super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl = (formatter *)0x0;
      (*peVar3->_vptr_sink[5])(peVar3,&local_40);
      if (local_40._M_head_impl != (formatter *)0x0) {
        (*(local_40._M_head_impl)->_vptr_formatter[1])();
      }
      local_40._M_head_impl = (formatter *)0x0;
    }
    else {
      (*((f->_M_t).super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>
         ._M_t.super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
         super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl)->_vptr_formatter[3])
                (&local_38);
      (*peVar3->_vptr_sink[5])(peVar3,&local_38);
      if (local_38 != (long *)0x0) {
        (**(code **)(*local_38 + 8))();
      }
      local_38 = (long *)0x0;
    }
  }
  return;
}

Assistant:

SPDLOG_INLINE void logger::set_formatter(std::unique_ptr<formatter> f)
{
    for (auto it = sinks_.begin(); it != sinks_.end(); ++it)
    {
        if (std::next(it) == sinks_.end())
        {
            // last element - we can be move it.
            (*it)->set_formatter(std::move(f));
        }
        else
        {
            (*it)->set_formatter(f->clone());
        }
    }
}